

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

void __thiscall
leveldb::anon_unknown_1::PosixRandomAccessFile::~PosixRandomAccessFile(PosixRandomAccessFile *this)

{
  PosixRandomAccessFile *this_local;
  
  if ((this->has_permanent_fd_ & 1U) != 0) {
    if (this->fd_ == -1) {
      __assert_fail("fd_ != -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/env_posix.cc"
                    ,0xa5,
                    "virtual leveldb::(anonymous namespace)::PosixRandomAccessFile::~PosixRandomAccessFile()"
                   );
    }
    close(this->fd_);
    Limiter::Release(this->fd_limiter_);
  }
  std::__cxx11::string::~string((string *)&this->filename_);
  RandomAccessFile::~RandomAccessFile(&this->super_RandomAccessFile);
  return;
}

Assistant:

~PosixRandomAccessFile() override {
    if (has_permanent_fd_) {
      assert(fd_ != -1);
      ::close(fd_);
      fd_limiter_->Release();
    }
  }